

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# turbopacking32.h
# Opt level: O0

void packforblock12(uint32_t base,uint32_t **pin,uint8_t **pw)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  uint32_t uVar9;
  uint32_t uVar10;
  uint32_t uVar11;
  uint32_t uVar12;
  uint32_t uVar13;
  uint32_t uVar14;
  uint32_t uVar15;
  uint32_t uVar16;
  uint32_t uVar17;
  uint32_t uVar18;
  uint32_t uVar19;
  uint32_t uVar20;
  uint32_t uVar21;
  uint32_t uVar22;
  uint32_t uVar23;
  uint32_t uVar24;
  uint32_t uVar25;
  uint32_t uVar26;
  uint32_t uVar27;
  uint32_t uVar28;
  uint32_t uVar29;
  uint32_t uVar30;
  ulong *puVar31;
  uint32_t *puVar32;
  uint64_t w5;
  uint64_t w4;
  uint64_t w3;
  uint64_t w2;
  uint64_t w1;
  uint64_t w0;
  uint32_t *in;
  uint64_t *pw64;
  uint8_t **pw_local;
  uint32_t **pin_local;
  uint32_t base_local;
  
  puVar31 = (ulong *)*pw;
  puVar32 = *pin;
  uVar1 = puVar32[5];
  uVar2 = puVar32[6];
  uVar3 = puVar32[7];
  uVar4 = puVar32[8];
  uVar5 = puVar32[9];
  uVar6 = puVar32[10];
  uVar7 = puVar32[10];
  uVar8 = puVar32[0xb];
  uVar9 = puVar32[0xc];
  uVar10 = puVar32[0xd];
  uVar11 = puVar32[0xe];
  uVar12 = puVar32[0xf];
  uVar13 = puVar32[0x10];
  uVar14 = puVar32[0x11];
  uVar15 = puVar32[0x12];
  uVar16 = puVar32[0x13];
  uVar17 = puVar32[0x14];
  uVar18 = puVar32[0x15];
  uVar19 = puVar32[0x15];
  uVar20 = puVar32[0x16];
  uVar21 = puVar32[0x17];
  uVar22 = puVar32[0x18];
  uVar23 = puVar32[0x19];
  uVar24 = puVar32[0x1a];
  uVar25 = puVar32[0x1a];
  uVar26 = puVar32[0x1b];
  uVar27 = puVar32[0x1c];
  uVar28 = puVar32[0x1d];
  uVar29 = puVar32[0x1e];
  uVar30 = puVar32[0x1f];
  *puVar31 = (ulong)(puVar32[5] - base) << 0x3c |
             (ulong)(puVar32[4] - base) << 0x30 |
             (ulong)(puVar32[3] - base) << 0x24 |
             (ulong)(puVar32[2] - base) << 0x18 |
             (ulong)(puVar32[1] - base) << 0xc | (ulong)(*puVar32 - base);
  puVar31[1] = (ulong)(uVar6 - base) << 0x38 |
               (ulong)(uVar5 - base) << 0x2c |
               (ulong)(uVar4 - base) << 0x20 |
               (ulong)(uVar3 - base) << 0x14 |
               (ulong)(uVar2 - base) << 8 | (ulong)(uVar1 - base >> 4);
  puVar31[2] = (ulong)(uVar12 - base) << 0x34 |
               (ulong)(uVar11 - base) << 0x28 |
               (ulong)(uVar10 - base) << 0x1c |
               (ulong)(uVar9 - base) << 0x10 |
               (ulong)(uVar8 - base) << 4 | (ulong)(uVar7 - base >> 8);
  puVar31[3] = (ulong)(uVar18 - base) << 0x3c |
               (ulong)(uVar17 - base) << 0x30 |
               (ulong)(uVar16 - base) << 0x24 |
               (ulong)(uVar15 - base) << 0x18 |
               (ulong)(uVar14 - base) << 0xc | (ulong)(uVar13 - base);
  puVar31[4] = (ulong)(uVar24 - base) << 0x38 |
               (ulong)(uVar23 - base) << 0x2c |
               (ulong)(uVar22 - base) << 0x20 |
               (ulong)(uVar21 - base) << 0x14 |
               (ulong)(uVar20 - base) << 8 | (ulong)(uVar19 - base >> 4);
  puVar31[5] = (ulong)(uVar30 - base) << 0x34 |
               (ulong)(uVar29 - base) << 0x28 |
               (ulong)(uVar28 - base) << 0x1c |
               (ulong)(uVar27 - base) << 0x10 |
               (ulong)(uVar26 - base) << 4 | (ulong)(uVar25 - base >> 8);
  *pin = *pin + 0x20;
  *pw = *pw + 0x30;
  return;
}

Assistant:

static void packforblock12(const uint32_t base, const uint32_t **pin,
                           uint8_t **pw) {
  uint64_t *pw64 = *(uint64_t **)pw;
  const uint32_t *in = *pin;
  /* we are going to touch  6 64-bit words */
  uint64_t w0;
  uint64_t w1;
  uint64_t w2;
  uint64_t w3;
  uint64_t w4;
  uint64_t w5;
  w0 = (uint64_t)(in[0] - base);
  w0 |= (uint64_t)(in[1] - base) << 12;
  w0 |= (uint64_t)(in[2] - base) << 24;
  w0 |= (uint64_t)(in[3] - base) << 36;
  w0 |= (uint64_t)(in[4] - base) << 48;
  w0 |= (uint64_t)(in[5] - base) << 60;
  w1 = (uint64_t)(in[5] - base) >> 4;
  w1 |= (uint64_t)(in[6] - base) << 8;
  w1 |= (uint64_t)(in[7] - base) << 20;
  w1 |= (uint64_t)(in[8] - base) << 32;
  w1 |= (uint64_t)(in[9] - base) << 44;
  w1 |= (uint64_t)(in[10] - base) << 56;
  w2 = (uint64_t)(in[10] - base) >> 8;
  w2 |= (uint64_t)(in[11] - base) << 4;
  w2 |= (uint64_t)(in[12] - base) << 16;
  w2 |= (uint64_t)(in[13] - base) << 28;
  w2 |= (uint64_t)(in[14] - base) << 40;
  w2 |= (uint64_t)(in[15] - base) << 52;
  w3 = (uint64_t)(in[16] - base);
  w3 |= (uint64_t)(in[17] - base) << 12;
  w3 |= (uint64_t)(in[18] - base) << 24;
  w3 |= (uint64_t)(in[19] - base) << 36;
  w3 |= (uint64_t)(in[20] - base) << 48;
  w3 |= (uint64_t)(in[21] - base) << 60;
  w4 = (uint64_t)(in[21] - base) >> 4;
  w4 |= (uint64_t)(in[22] - base) << 8;
  w4 |= (uint64_t)(in[23] - base) << 20;
  w4 |= (uint64_t)(in[24] - base) << 32;
  w4 |= (uint64_t)(in[25] - base) << 44;
  w4 |= (uint64_t)(in[26] - base) << 56;
  w5 = (uint64_t)(in[26] - base) >> 8;
  w5 |= (uint64_t)(in[27] - base) << 4;
  w5 |= (uint64_t)(in[28] - base) << 16;
  w5 |= (uint64_t)(in[29] - base) << 28;
  w5 |= (uint64_t)(in[30] - base) << 40;
  w5 |= (uint64_t)(in[31] - base) << 52;
  pw64[0] = w0;
  pw64[1] = w1;
  pw64[2] = w2;
  pw64[3] = w3;
  pw64[4] = w4;
  pw64[5] = w5;
  *pin += 32; /* we consumed 32 32-bit integers */
  *pw += 48;  /* we used up 48 output bytes */
}